

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  uVar8 = (ulong)(uint)(other->bigits_).super_buffer<unsigned_int>.size_;
  if (uVar8 != 0) {
    puVar7 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar3 = (long)(other->exp_ - this->exp_);
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar4 = lVar3 << 0x20;
    uVar9 = 0;
    lVar10 = 0;
    do {
      lVar4 = lVar4 + 0x100000000;
      lVar11 = (ulong)puVar1[lVar3 + uVar9] + (lVar10 - (ulong)puVar7[uVar9]);
      puVar1[lVar3 + uVar9] = (uint)lVar11;
      lVar10 = lVar11 >> 0x3f;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    if (lVar11 < 0) {
      puVar7 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar8 = (ulong)*(uint *)((long)puVar7 + (lVar4 >> 0x1e));
      lVar3 = -1;
      do {
        uVar8 = (uVar8 & 0xffffffff) + lVar3;
        lVar3 = (long)uVar8 >> 0x3f;
      } while ((long)uVar8 < 0);
      *(int *)((long)puVar7 + (lVar4 >> 0x1e)) = (int)uVar8;
      remove_leading_zeros(this);
      return;
    }
  }
  uVar8 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar5 = 1;
  if ((int)uVar8 < 1) {
    iVar5 = (int)uVar8;
  }
  puVar7 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar8 & 0xffffffff);
  do {
    puVar7 = puVar7 + -1;
    iVar2 = (int)uVar8;
    iVar6 = iVar5;
    if (iVar2 < 2) break;
    uVar8 = (ulong)(iVar2 - 1);
    iVar6 = iVar2;
  } while (*puVar7 == 0);
  uVar8 = (ulong)iVar6;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar8) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar8);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar8;
  return;
}

Assistant:

std::size_t size() const FMT_NOEXCEPT { return size_; }